

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void outflushn(int nl)

{
  outflushn_stream(&G_std_disp,nl);
  if (logfp != (osfildef *)0x0) {
    outflushn_stream(&G_log_disp,nl);
    fflush((FILE *)logfp);
    return;
  }
  return;
}

Assistant:

void outflushn(int nl)
{
    /* flush the display stream */
    outflushn_stream(&G_std_disp, nl);

    /* flush the log stream, if we have an open log file */
    if (logfp != 0)
    {
        outflushn_stream(&G_log_disp, nl);
        osfflush(logfp);
    }
}